

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FieldMap.cpp
# Opt level: O0

void __thiscall FIX::FieldMap::removeGroup(FieldMap *this,int tag)

{
  bool bVar1;
  pointer ppVar2;
  iterator iVar3;
  iterator iVar4;
  undefined1 local_40 [8];
  vector<FIX::FieldMap_*,_std::allocator<FIX::FieldMap_*>_> toDelete;
  _Self local_20;
  iterator tagWithGroups;
  int tag_local;
  FieldMap *this_local;
  
  tagWithGroups._M_node._4_4_ = tag;
  local_20._M_node =
       (_Base_ptr)
       std::
       map<int,_std::vector<FIX::FieldMap_*,_std::allocator<FIX::FieldMap_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<FIX::FieldMap_*,_std::allocator<FIX::FieldMap_*>_>_>_>_>
       ::find(&this->m_groups,(key_type *)((long)&tagWithGroups._M_node + 4));
  toDelete.super__Vector_base<FIX::FieldMap_*,_std::allocator<FIX::FieldMap_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)std::
                map<int,_std::vector<FIX::FieldMap_*,_std::allocator<FIX::FieldMap_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<FIX::FieldMap_*,_std::allocator<FIX::FieldMap_*>_>_>_>_>
                ::end(&this->m_groups);
  bVar1 = std::operator==(&local_20,
                          (_Self *)&toDelete.
                                    super__Vector_base<FIX::FieldMap_*,_std::allocator<FIX::FieldMap_*>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
  if (!bVar1) {
    std::vector<FIX::FieldMap_*,_std::allocator<FIX::FieldMap_*>_>::vector
              ((vector<FIX::FieldMap_*,_std::allocator<FIX::FieldMap_*>_> *)local_40);
    ppVar2 = std::
             _Rb_tree_iterator<std::pair<const_int,_std::vector<FIX::FieldMap_*,_std::allocator<FIX::FieldMap_*>_>_>_>
             ::operator->(&local_20);
    std::vector<FIX::FieldMap_*,_std::allocator<FIX::FieldMap_*>_>::swap
              ((vector<FIX::FieldMap_*,_std::allocator<FIX::FieldMap_*>_> *)local_40,&ppVar2->second
              );
    std::
    map<int,std::vector<FIX::FieldMap*,std::allocator<FIX::FieldMap*>>,std::less<int>,std::allocator<std::pair<int_const,std::vector<FIX::FieldMap*,std::allocator<FIX::FieldMap*>>>>>
    ::erase_abi_cxx11_((map<int,std::vector<FIX::FieldMap*,std::allocator<FIX::FieldMap*>>,std::less<int>,std::allocator<std::pair<int_const,std::vector<FIX::FieldMap*,std::allocator<FIX::FieldMap*>>>>>
                        *)&this->m_groups,(iterator)local_20._M_node);
    iVar3 = std::vector<FIX::FieldMap_*,_std::allocator<FIX::FieldMap_*>_>::begin
                      ((vector<FIX::FieldMap_*,_std::allocator<FIX::FieldMap_*>_> *)local_40);
    iVar4 = std::vector<FIX::FieldMap_*,_std::allocator<FIX::FieldMap_*>_>::end
                      ((vector<FIX::FieldMap_*,_std::allocator<FIX::FieldMap_*>_> *)local_40);
    std::
    for_each<__gnu_cxx::__normal_iterator<FIX::FieldMap**,std::vector<FIX::FieldMap*,std::allocator<FIX::FieldMap*>>>,FIX::FieldMap::removeGroup(int)::__0>
              (iVar3._M_current,iVar4._M_current);
    removeField(this,tagWithGroups._M_node._4_4_);
    std::vector<FIX::FieldMap_*,_std::allocator<FIX::FieldMap_*>_>::~vector
              ((vector<FIX::FieldMap_*,_std::allocator<FIX::FieldMap_*>_> *)local_40);
  }
  return;
}

Assistant:

void FieldMap::removeGroup(int tag) {
  Groups::iterator tagWithGroups = m_groups.find(tag);
  if (tagWithGroups == m_groups.end()) {
    return;
  }

  std::vector<FieldMap *> toDelete;
  toDelete.swap(tagWithGroups->second);

  m_groups.erase(tagWithGroups);

  std::for_each(toDelete.begin(), toDelete.end(), [](FieldMap *group) { delete group; });

  removeField(tag);
}